

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

int gdImageColorAllocateAlpha(gdImagePtr im,int r,int g,int b,int a)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if (im->trueColor != 0) {
    return b + a * 0x1000000 + g * 0x100 + r * 0x10000;
  }
  iVar1 = im->colorsTotal;
  iVar2 = -1;
  if (0 < (long)iVar1) {
    lVar3 = 0;
    do {
      if (im->open[lVar3] != 0) {
        iVar2 = (int)lVar3;
        break;
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  if (iVar2 == -1) {
    if (iVar1 == 0x100) {
      return -1;
    }
    im->colorsTotal = iVar1 + 1;
    iVar2 = iVar1;
  }
  im->red[iVar2] = r;
  im->green[iVar2] = g;
  im->blue[iVar2] = b;
  im->alpha[iVar2] = a;
  im->open[iVar2] = 0;
  return iVar2;
}

Assistant:

BGD_DECLARE(int) gdImageColorAllocateAlpha (gdImagePtr im, int r, int g, int b, int a)
{
	int i;
	int ct = (-1);
	if (im->trueColor) {
		return gdTrueColorAlpha (r, g, b, a);
	}
	for (i = 0; (i < (im->colorsTotal)); i++) {
		if (im->open[i]) {
			ct = i;
			break;
		}
	}
	if (ct == (-1)) {
		ct = im->colorsTotal;
		if (ct == gdMaxColors) {
			return -1;
		}
		im->colorsTotal++;
	}
	im->red[ct] = r;
	im->green[ct] = g;
	im->blue[ct] = b;
	im->alpha[ct] = a;
	im->open[ct] = 0;
	return ct;
}